

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcProduct::~IfcProduct(IfcProduct *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  bitset<1UL> *pbVar3;
  
  *(undefined8 *)&this[-1].super_IfcObject.field_0x80 = 0x8d9f00;
  *(undefined8 *)&(this->super_IfcObject).field_0x68 = 0x8d9f78;
  *(undefined8 *)&this[-1].field_0x108 = 0x8d9f28;
  *(undefined8 *)&this->super_IfcObject = 0x8d9f50;
  puVar1 = *(undefined1 **)&(this->super_IfcObject).field_0x10;
  puVar2 = &(this->super_IfcObject).field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcObject.field_0x80 = 0x8da018;
  *(undefined8 *)&(this->super_IfcObject).field_0x68 = 0x8da040;
  puVar2 = *(undefined1 **)&this[-1].super_IfcObject.field_0xe0;
  if ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProductRepresentation>_> *)puVar2 !=
      &this[-1].Representation) {
    operator_delete(puVar2,(ulong)((long)&(this[-1].Representation.ptr.obj)->id + 1));
  }
  puVar1 = *(undefined1 **)
            &this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
             field_0x20;
  puVar2 = &this[-1].super_IfcObject.field_0xc8;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcObject.field_0x90;
  pbVar3 = &this[-1].super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
            aux_is_derived;
  if ((bitset<1UL> *)puVar2 != pbVar3) {
    operator_delete(puVar2,(pbVar3->super__Base_bitset<1UL>)._M_w + 1);
  }
  operator_delete(&this[-1].super_IfcObject.field_0x80,0x118);
  return;
}

Assistant:

IfcProduct() : Object("IfcProduct") {}